

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O1

void __thiscall oqpi::posix_thread::~posix_thread(posix_thread *this)

{
  code *pcVar1;
  eAssertResult eVar2;
  
  if (this->handle_ != 0) {
    eVar2 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/threading/posix_thread.hpp"
                            ,0x2f,"handle_ == 0","");
    if (eVar2 == eAR_Retry) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    this->handle_ = 0;
  }
  return;
}

Assistant:

~posix_thread()
        {
            // The interface should have taken care of either joining or terminating the thread
            if (oqpi_failed(handle_ == 0))
            {
                handle_ = 0;
            }
        }